

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralMiniIndex.hpp
# Opt level: O0

bool __thiscall Indexing::LiteralMiniIndex::InstanceIterator::hasNext(InstanceIterator *this)

{
  byte *in_RDI;
  Literal *unaff_retaddr;
  byte *pbVar1;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar2;
  
  pbVar1 = in_RDI;
  if ((*in_RDI & 1) == 0) {
    while (**(int **)(in_RDI + 0x18) == *(int *)(in_RDI + 4)) {
      bVar2 = Kernel::MatchingUtils::match
                        (unaff_retaddr,
                         (Literal *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                         SUB81((ulong)pbVar1 >> 0x38,0));
      if (bVar2) {
        *in_RDI = 1;
        return true;
      }
      *(long *)(in_RDI + 0x18) = *(long *)(in_RDI + 0x18) + 0x10;
    }
    bVar2 = false;
  }
  else {
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool hasNext()
    {
      if(_ready) { return true; }
      while(_curr->_header==_hdr) {
        if(MatchingUtils::match(_query, _curr->_lit, _compl)) {
          _ready=true;
          return true;
        }
        _curr++;
      }
      return false;
    }